

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O1

uint __thiscall
llvm::DWARFVerifier::verifyNameIndexAttribute
          (DWARFVerifier *this,NameIndex *NI,Abbrev *Abbr,AttributeEncoding AttrEnc)

{
  bool bVar1;
  raw_ostream *prVar2;
  uint Encoding;
  undefined1 in_R8B;
  FormClassTable *pFVar3;
  StringRef Fmt;
  StringRef Fmt_00;
  StringRef Fmt_01;
  StringRef SVar4;
  tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
  local_118;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>_>
  local_c8;
  Index local_38;
  Form FStack_34;
  AttributeEncoding AttrEnc_local;
  
  FStack_34 = AttrEnc.Form;
  Encoding = (uint)FStack_34;
  _local_38 = AttrEnc;
  SVar4 = dwarf::FormEncodingString(Encoding);
  local_118.
  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
  .
  super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
  .
  super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
  .super__Head_base<2UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_false>.
  _M_head_impl.Item = &Abbr->Code;
  if (SVar4.Length == 0) {
    prVar2 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xbe8acc,(StringRef)ZEXT816(0),
                              (bool)in_R8B);
    local_118.
    super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .super__Head_base<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_false>.
    _M_head_impl.Item = (uint *)NI->Base;
    local_118.
    super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .super__Tuple_impl<4UL,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>.
    super__Head_base<4UL,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>,_false>
    ._M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_00d8cf48;
    local_118.
    super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .super__Head_base<3UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_false>.
    _M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_00d8d4a8;
    local_118.
    super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .super__Head_base<3UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_false>.
    _M_head_impl.Item = (Form *)&stack0xffffffffffffffc8;
    local_118.
    super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .super__Head_base<2UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_false>.
    _M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_00d8d198;
    local_118.
    super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .super__Head_base<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_false>.
    _M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_00d8d168;
    SVar4.Length = 0x46;
    SVar4.Data = "NameIndex @ {0:x}: Abbreviation {1:x}: {2} uses an unknown form: {3}.\n";
    local_118.
    super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .super__Tuple_impl<4UL,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>.
    super__Head_base<4UL,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>,_false>
    ._M_head_impl.Item = (StringLiteral *)&stack0xffffffffffffffcc;
    formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>_>_>
    ::formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>_>_>
                      *)&local_c8,SVar4,
                     (tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>_>
                      *)&local_118);
    raw_ostream::operator<<(prVar2,&local_c8.super_formatv_object_base);
    goto LAB_00b1d4ad;
  }
  local_118.
  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
  .
  super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
  .
  super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
  .
  super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
  .super__Head_base<3UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_false>.
  _M_head_impl.Item = &stack0xffffffffffffffcc;
  if (FStack_34 != DW_FORM_data8 && local_38 == DW_IDX_type_hash) {
    prVar2 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xbe8acc,(StringRef)ZEXT816(0),
                              (bool)in_R8B);
    local_118.
    super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .super__Head_base<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_false>.
    _M_head_impl.Item = (uint *)NI->Base;
    local_118.
    super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .super__Tuple_impl<4UL,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>.
    super__Head_base<4UL,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>,_false>
    ._M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_00d8d4d8;
    local_118.
    super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .super__Tuple_impl<4UL,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>.
    super__Head_base<4UL,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>,_false>
    ._M_head_impl.Item =
         (StringLiteral *)
         CONCAT62(local_118.
                  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
                  .
                  super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
                  .
                  super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
                  .
                  super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
                  .
                  super__Tuple_impl<4UL,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
                  .
                  super__Head_base<4UL,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>,_false>
                  ._M_head_impl.Item._2_6_,7);
    local_118.
    super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .super__Head_base<3UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_false>.
    _M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_00d8cf48;
    local_118.
    super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .super__Head_base<2UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_false>.
    _M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_00d8d198;
    local_118.
    super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .super__Head_base<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_false>.
    _M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_00d8d168;
    Fmt.Length = 0x65;
    Fmt.Data = 
    "NameIndex @ {0:x}: Abbreviation {1:x}: DW_IDX_type_hash uses an unexpected form {2} (should be {3}).\n"
    ;
    formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form>_>_>
    ::formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form>_>_>
                      *)&local_c8,Fmt,
                     (tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form>_>
                      *)&local_118);
    raw_ostream::operator<<(prVar2,&local_c8.super_formatv_object_base);
    goto LAB_00b1d4ad;
  }
  switch(local_38) {
  case DW_IDX_compile_unit:
    pFVar3 = verifyNameIndexAttribute::Table;
    break;
  case DW_IDX_type_unit:
    pFVar3 = (FormClassTable *)0xd8d388;
    break;
  case DW_IDX_die_offset:
    pFVar3 = (FormClassTable *)0xd8d3a0;
    break;
  case DW_IDX_parent:
    pFVar3 = (FormClassTable *)0xd8d3b8;
    break;
  default:
    pFVar3 = (FormClassTable *)&DAT_00d8d3d0;
    bVar1 = true;
    goto LAB_00b1d53c;
  }
  bVar1 = false;
LAB_00b1d53c:
  if (bVar1) {
    prVar2 = WithColor::warning((WithColor *)this->OS,(raw_ostream *)0xbe8acc,(StringRef)ZEXT816(0),
                                (bool)in_R8B);
    local_118.
    super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .super__Head_base<2UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_false>.
    _M_head_impl.Item = (Index *)NI->Base;
    local_118.
    super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .super__Tuple_impl<4UL,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>.
    super__Head_base<4UL,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>,_false>
    ._M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_00d8d4a8;
    local_118.
    super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .super__Tuple_impl<4UL,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>.
    super__Head_base<4UL,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>,_false>
    ._M_head_impl.Item = (StringLiteral *)&stack0xffffffffffffffc8;
    local_118.
    super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .super__Head_base<3UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_false>.
    _M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_00d8d198;
    local_118.
    super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .super__Head_base<2UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_false>.
    _M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_00d8d168;
    Fmt_00.Length = 0x50;
    Fmt_00.Data = 
    "NameIndex @ {0:x}: Abbreviation {1:x} contains an unknown index attribute: {2}.\n";
    local_118.
    super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .
    super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
    .super__Head_base<3UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_false>.
    _M_head_impl.Item = (Form *)Abbr;
    formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>_>_>
    ::formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>_>_>
                      *)&local_c8,Fmt_00,
                     (tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>_>
                      *)&local_118);
    raw_ostream::operator<<(prVar2,&local_c8.super_formatv_object_base);
    if (local_c8.super_formatv_object_base.Replacements.
        super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.super_formatv_object_base.Replacements.
                      super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_c8.super_formatv_object_base.Replacements.
                            super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.super_formatv_object_base.Replacements.
                            super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_c8.super_formatv_object_base.Adapters.
        super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.super_formatv_object_base.Adapters.
                      super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_c8.super_formatv_object_base.Adapters.
                            super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.super_formatv_object_base.Adapters.
                            super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return 0;
  }
  local_c8.super_formatv_object_base.Fmt.Data._0_2_ = FStack_34;
  local_c8.super_formatv_object_base.Fmt.Length = 0;
  local_c8.super_formatv_object_base.Adapters.
  super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super_formatv_object_base.Adapters.
  super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.super_formatv_object_base.Replacements.
  super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  bVar1 = DWARFFormValue::isFormClass((DWARFFormValue *)&local_c8,pFVar3->Class);
  if (bVar1) {
    return 0;
  }
  prVar2 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xbe8acc,(StringRef)ZEXT816(0),
                            (bool)in_R8B);
  local_118.
  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
  .super__Head_base<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_false>._M_head_impl.
  Item = NI->Base;
  local_118.
  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
  .
  super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
  .
  super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
  .
  super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
  .super__Tuple_impl<4UL,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>.
  super__Head_base<4UL,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>,_false>.
  _M_head_impl.Item = &pFVar3->ClassName;
  local_118.
  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
  .
  super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
  .
  super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
  .
  super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
  .super__Tuple_impl<4UL,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>.
  super__Head_base<4UL,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>,_false>.
  _M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_00d8d508;
  local_118.
  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
  .
  super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
  .
  super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
  .
  super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
  .super__Head_base<3UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_false>.
  _M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_00d8cf48;
  local_118.
  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
  .
  super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
  .
  super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
  .super__Head_base<2UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_false>.
  _M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_00d8d4a8;
  local_118.
  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
  .
  super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
  .
  super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
  .super__Head_base<2UL,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_false>.
  _M_head_impl.Item = &stack0xffffffffffffffc8;
  local_118.
  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
  .
  super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
  .super__Head_base<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_false>.
  _M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_00d8d198;
  local_118.
  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
  .super__Head_base<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_false>._M_head_impl.
  super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_00d8d168;
  Fmt_01.Length = 0x62;
  Fmt_01.Data = 
  "NameIndex @ {0:x}: Abbreviation {1:x}: {2} uses an unexpected form {3} (expected form class {4}).\n"
  ;
  local_118.
  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
  .
  super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>
  .super__Head_base<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_false>.
  _M_head_impl.Item = &Abbr->Code;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>_>
  ::formatv_object(&local_c8,Fmt_01,&local_118);
  raw_ostream::operator<<(prVar2,&local_c8.super_formatv_object_base);
LAB_00b1d4ad:
  if (local_c8.super_formatv_object_base.Replacements.
      super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super_formatv_object_base.Replacements.
                    super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.super_formatv_object_base.Replacements.
                          super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super_formatv_object_base.Replacements.
                          super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8.super_formatv_object_base.Adapters.
      super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super_formatv_object_base.Adapters.
                    super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.super_formatv_object_base.Adapters.
                          super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super_formatv_object_base.Adapters.
                          super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return 1;
}

Assistant:

unsigned DWARFVerifier::verifyNameIndexAttribute(
    const DWARFDebugNames::NameIndex &NI, const DWARFDebugNames::Abbrev &Abbr,
    DWARFDebugNames::AttributeEncoding AttrEnc) {
  StringRef FormName = dwarf::FormEncodingString(AttrEnc.Form);
  if (FormName.empty()) {
    error() << formatv("NameIndex @ {0:x}: Abbreviation {1:x}: {2} uses an "
                       "unknown form: {3}.\n",
                       NI.getUnitOffset(), Abbr.Code, AttrEnc.Index,
                       AttrEnc.Form);
    return 1;
  }

  if (AttrEnc.Index == DW_IDX_type_hash) {
    if (AttrEnc.Form != dwarf::DW_FORM_data8) {
      error() << formatv(
          "NameIndex @ {0:x}: Abbreviation {1:x}: DW_IDX_type_hash "
          "uses an unexpected form {2} (should be {3}).\n",
          NI.getUnitOffset(), Abbr.Code, AttrEnc.Form, dwarf::DW_FORM_data8);
      return 1;
    }
  }

  // A list of known index attributes and their expected form classes.
  // DW_IDX_type_hash is handled specially in the check above, as it has a
  // specific form (not just a form class) we should expect.
  struct FormClassTable {
    dwarf::Index Index;
    DWARFFormValue::FormClass Class;
    StringLiteral ClassName;
  };
  static constexpr FormClassTable Table[] = {
      {dwarf::DW_IDX_compile_unit, DWARFFormValue::FC_Constant, {"constant"}},
      {dwarf::DW_IDX_type_unit, DWARFFormValue::FC_Constant, {"constant"}},
      {dwarf::DW_IDX_die_offset, DWARFFormValue::FC_Reference, {"reference"}},
      {dwarf::DW_IDX_parent, DWARFFormValue::FC_Constant, {"constant"}},
  };

  ArrayRef<FormClassTable> TableRef(Table);
  auto Iter = find_if(TableRef, [AttrEnc](const FormClassTable &T) {
    return T.Index == AttrEnc.Index;
  });
  if (Iter == TableRef.end()) {
    warn() << formatv("NameIndex @ {0:x}: Abbreviation {1:x} contains an "
                      "unknown index attribute: {2}.\n",
                      NI.getUnitOffset(), Abbr.Code, AttrEnc.Index);
    return 0;
  }

  if (!DWARFFormValue(AttrEnc.Form).isFormClass(Iter->Class)) {
    error() << formatv("NameIndex @ {0:x}: Abbreviation {1:x}: {2} uses an "
                       "unexpected form {3} (expected form class {4}).\n",
                       NI.getUnitOffset(), Abbr.Code, AttrEnc.Index,
                       AttrEnc.Form, Iter->ClassName);
    return 1;
  }
  return 0;
}